

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

void __thiscall HighsSplitDeque::popStolen(HighsSplitDeque *this)

{
  element_type *peVar1;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + -1;
  if ((*(byte *)(in_RDI + 0x38) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x38) = 1;
    std::atomic<bool>::store
              ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               SUB81((ulong)in_RDI >> 0x38,0),(memory_order)in_RDI);
    peVar1 = std::
             __shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4bdc3c);
    LOCK();
    (peVar1->haveJobs).super___atomic_base<int>._M_i =
         (peVar1->haveJobs).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  return;
}

Assistant:

void popStolen() {
    ownerData.head -= 1;
    if (!ownerData.allStolenCopy) {
      ownerData.allStolenCopy = true;
      stealerData.allStolen.store(true, std::memory_order_relaxed);
      ownerData.workerBunk->haveJobs.fetch_add(-1, std::memory_order_release);
    }
  }